

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O0

void D_PostEvent(event_t *ev)

{
  int iVar1;
  BYTE BVar2;
  SWORD SVar3;
  SWORD SVar4;
  SWORD SVar5;
  bool bVar6;
  event_t *peVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  int local_14;
  int look;
  event_t *ev_local;
  
  if ((ev->type != '\x05') || (events[eventhead].type != '\x05')) {
    lVar8 = (long)eventhead;
    peVar7 = events + lVar8;
    BVar2 = ev->subtype;
    SVar3 = ev->data1;
    SVar4 = ev->data2;
    SVar5 = ev->data3;
    peVar7->type = ev->type;
    peVar7->subtype = BVar2;
    peVar7->data1 = SVar3;
    peVar7->data2 = SVar4;
    peVar7->data3 = SVar5;
    iVar1 = ev->y;
    events[lVar8].x = ev->x;
    events[lVar8].y = iVar1;
    if ((ev->type == '\x03') &&
       ((((paused == 0 && (menuactive == MENU_Off)) && (ConsoleState != c_down)) &&
        (ConsoleState != c_falling)))) {
      if ((Button_Mlook.bDown != '\0') ||
         (bVar6 = FBoolCVar::operator_cast_to_bool(&freelook), bVar6)) {
        iVar1 = ev->y;
        fVar9 = FFloatCVar::operator_cast_to_float(&m_pitch);
        fVar10 = FFloatCVar::operator_cast_to_float(&mouse_sensitivity);
        local_14 = (int)((float)iVar1 * fVar9 * fVar10 * 16.0);
        bVar6 = FBoolCVar::operator_cast_to_bool(&invertmouse);
        if (bVar6) {
          local_14 = -local_14;
        }
        G_AddViewPitch(local_14);
        events[eventhead].y = 0;
      }
      if ((Button_Strafe.bDown == '\0') &&
         (bVar6 = FBoolCVar::operator_cast_to_bool(&lookstrafe), !bVar6)) {
        iVar1 = ev->x;
        fVar9 = FFloatCVar::operator_cast_to_float(&m_yaw);
        fVar10 = FFloatCVar::operator_cast_to_float(&mouse_sensitivity);
        G_AddViewAngle((int)((float)iVar1 * fVar9 * fVar10 * 8.0));
        events[eventhead].x = 0;
      }
      if (events[eventhead].x == 0 && events[eventhead].y == 0) {
        return;
      }
    }
    eventhead = eventhead + 1U & 0x7f;
  }
  return;
}

Assistant:

void D_PostEvent (const event_t *ev)
{
	// Do not post duplicate consecutive EV_DeviceChange events.
	if (ev->type == EV_DeviceChange && events[eventhead].type == EV_DeviceChange)
	{
		return;
	}
	events[eventhead] = *ev;
	if (ev->type == EV_Mouse && !paused && menuactive == MENU_Off && ConsoleState != c_down && ConsoleState != c_falling
		)
	{
		if (Button_Mlook.bDown || freelook)
		{
			int look = int(ev->y * m_pitch * mouse_sensitivity * 16.0);
			if (invertmouse)
				look = -look;
			G_AddViewPitch (look);
			events[eventhead].y = 0;
		}
		if (!Button_Strafe.bDown && !lookstrafe)
		{
			G_AddViewAngle (int(ev->x * m_yaw * mouse_sensitivity * 8.0));
			events[eventhead].x = 0;
		}
		if ((events[eventhead].x | events[eventhead].y) == 0)
		{
			return;
		}
	}
	eventhead = (eventhead+1)&(MAXEVENTS-1);
}